

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_impl.cc
# Opt level: O2

bool __thiscall
webrtc::TraceImpl::CreateFileName
          (TraceImpl *this,char *file_name_utf8,char *file_name_with_counter_utf8,uint32_t new_count
          )

{
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  sVar1 = strlen(file_name_utf8);
  uVar5 = (uint)sVar1;
  if (-1 < (int)uVar5) {
    uVar4 = (ulong)(uVar5 & 0x7fffffff);
    do {
      uVar3 = uVar4 - 1;
      if ((long)uVar4 < 2) break;
      uVar4 = uVar3;
    } while (file_name_utf8[uVar3] != '.');
    uVar2 = uVar5;
    if (uVar3 != 0) {
      uVar2 = (uint)uVar3;
    }
    sVar1 = (size_t)(int)uVar2;
    memcpy(file_name_with_counter_utf8,file_name_utf8,sVar1);
    sprintf(file_name_with_counter_utf8 + sVar1,"_%lu%s",(ulong)new_count,file_name_utf8 + sVar1);
  }
  return -1 < (int)uVar5;
}

Assistant:

bool TraceImpl::CreateFileName(
    const char file_name_utf8[FileWrapper::kMaxFileNameSize],
    char file_name_with_counter_utf8[FileWrapper::kMaxFileNameSize],
    const uint32_t new_count) const {
  int32_t length = (int32_t)strlen(file_name_utf8);
  if (length < 0) {
    return false;
  }

  int32_t length_without_file_ending = length - 1;
  while (length_without_file_ending > 0) {
    if (file_name_utf8[length_without_file_ending] == '.') {
      break;
    } else {
      length_without_file_ending--;
    }
  }
  if (length_without_file_ending == 0) {
    length_without_file_ending = length;
  }
  memcpy(file_name_with_counter_utf8, file_name_utf8,
         length_without_file_ending);
  sprintf(file_name_with_counter_utf8 + length_without_file_ending, "_%lu%s",
          static_cast<long unsigned int>(new_count),
          file_name_utf8 + length_without_file_ending);
  return true;
}